

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O1

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadTorus>::ClassId(TPZGeoElRefLess<pzgeom::TPZQuadTorus> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_1e0;
  TPZQuadTorus local_1c0;
  
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"TPZGeoElRefLess","");
  uVar1 = Hash(&local_1e0);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZQuadTorus::TPZQuadTorus(&local_1c0);
  iVar3 = pzgeom::TPZQuadTorus::ClassId(&local_1c0);
  local_1c0.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.
  super_TPZQuadrilateral.super_TPZSavable._vptr_TPZSavable = (TPZSavable)&PTR__TPZQuadTorus_018c4a20
  ;
  TPZFMatrix<double>::~TPZFMatrix(&local_1c0.fPhiTheta.super_TPZFMatrix<double>,&PTR_PTR_018aedf8);
  TPZManVector<double,_10>::~TPZManVector(&local_1c0.fOrigin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}